

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int header_afiol(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,size_t *name_pad
                )

{
  void *pvVar1;
  dev_t dVar2;
  int64_t iVar3;
  size_t sVar4;
  char *header;
  void *h;
  size_t *name_pad_local;
  size_t *namelength_local;
  archive_entry *entry_local;
  cpio *cpio_local;
  archive_read *a_local;
  
  (a->archive).archive_format = 0x10006;
  (a->archive).archive_format_name = "afio large ASCII";
  pvVar1 = __archive_read_ahead(a,0x74,(ssize_t *)0x0);
  if (pvVar1 == (void *)0x0) {
    a_local._4_4_ = -0x1e;
  }
  else {
    dVar2 = atol16((char *)((long)pvVar1 + 6),8);
    archive_entry_set_dev(entry,dVar2);
    iVar3 = atol16((char *)((long)pvVar1 + 0xe),0x10);
    archive_entry_set_ino(entry,iVar3);
    iVar3 = atol8((char *)((long)pvVar1 + 0x1f),6);
    archive_entry_set_mode(entry,(mode_t)iVar3);
    iVar3 = atol16((char *)((long)pvVar1 + 0x25),8);
    archive_entry_set_uid(entry,iVar3);
    iVar3 = atol16((char *)((long)pvVar1 + 0x2d),8);
    archive_entry_set_gid(entry,iVar3);
    iVar3 = atol16((char *)((long)pvVar1 + 0x35),8);
    archive_entry_set_nlink(entry,(uint)iVar3);
    dVar2 = atol16((char *)((long)pvVar1 + 0x3d),8);
    archive_entry_set_rdev(entry,dVar2);
    iVar3 = atol16((char *)((long)pvVar1 + 0x45),0x10);
    archive_entry_set_mtime(entry,iVar3,0);
    sVar4 = atol16((char *)((long)pvVar1 + 0x56),4);
    *namelength = sVar4;
    *name_pad = 0;
    iVar3 = atol16((char *)((long)pvVar1 + 99),0x10);
    cpio->entry_bytes_remaining = iVar3;
    archive_entry_set_size(entry,cpio->entry_bytes_remaining);
    cpio->entry_padding = 0;
    __archive_read_consume(a,0x74);
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
header_afiol(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	const char *header;

	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_AFIO_LARGE;
	a->archive.archive_format_name = "afio large ASCII";

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, afiol_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out octal fields. */
	header = (const char *)h;

	archive_entry_set_dev(entry, 
		(dev_t)atol16(header + afiol_dev_offset, afiol_dev_size));
	archive_entry_set_ino(entry, atol16(header + afiol_ino_offset, afiol_ino_size));
	archive_entry_set_mode(entry,
		(mode_t)atol8(header + afiol_mode_offset, afiol_mode_size));
	archive_entry_set_uid(entry, atol16(header + afiol_uid_offset, afiol_uid_size));
	archive_entry_set_gid(entry, atol16(header + afiol_gid_offset, afiol_gid_size));
	archive_entry_set_nlink(entry,
		(unsigned int)atol16(header + afiol_nlink_offset, afiol_nlink_size));
	archive_entry_set_rdev(entry,
		(dev_t)atol16(header + afiol_rdev_offset, afiol_rdev_size));
	archive_entry_set_mtime(entry, atol16(header + afiol_mtime_offset, afiol_mtime_size), 0);
	*namelength = (size_t)atol16(header + afiol_namesize_offset, afiol_namesize_size);
	*name_pad = 0; /* No padding of filename. */

	cpio->entry_bytes_remaining =
	    atol16(header + afiol_filesize_offset, afiol_filesize_size);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	cpio->entry_padding = 0;
	__archive_read_consume(a, afiol_header_size);
	return (ARCHIVE_OK);
}